

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::DetermineHasMacOSXRpathInstallNameDir(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  string *__lhs;
  ImportInfo *pIVar4;
  ulong uVar5;
  long lVar6;
  cmake *this_01;
  string_view str;
  undefined1 local_278 [16];
  string local_268;
  undefined1 local_248 [8];
  cmake *cm;
  ostringstream w;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string install_name_1;
  ImportInfo *info;
  bool use_install_name;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue install_name;
  bool macosx_rpath;
  bool install_name_is_rpath;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  install_name.Value._7_1_ = 0;
  install_name.Value._6_1_ = 0;
  bVar1 = IsImported(this);
  if (bVar1) {
    pIVar4 = GetImportInfo(this,config);
    if (pIVar4 != (ImportInfo *)0x0) {
      if (((pIVar4->NoSOName & 1U) == 0) &&
         (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
        str = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pIVar4->SOName);
        install_name_1.field_2._8_8_ = str._M_len;
        bVar1 = cmHasLiteralPrefix<8ul>(str,(char (*) [8])"@rpath/");
        if (bVar1) {
          install_name.Value._7_1_ = 1;
        }
      }
      else {
        std::__cxx11::string::string((string *)local_a0);
        cmSystemTools::GuessLibraryInstallName(&pIVar4->Location,(string *)local_a0);
        lVar6 = std::__cxx11::string::find(local_a0,0xbee4d6);
        if (lVar6 != -1) {
          install_name.Value._7_1_ = 1;
        }
        std::__cxx11::string::~string((string *)local_a0);
      }
    }
    goto LAB_0058ac2a;
  }
  TVar3 = GetType(this);
  if (TVar3 != SHARED_LIBRARY) {
    return false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"INSTALL_NAME_DIR",&local_51);
  local_30 = GetProperty(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = MacOSXUseInstallNameDir(this);
  bVar2 = cmValue::operator_cast_to_bool(&local_30);
  if ((bVar2) && (bVar1)) {
    __lhs = cmValue::operator*[abi_cxx11_(&local_30);
    bVar2 = std::operator==(__lhs,"@rpath");
    if (!bVar2) goto LAB_0058ab07;
    install_name.Value._7_1_ = 1;
  }
  else {
LAB_0058ab07:
    bVar2 = cmValue::operator_cast_to_bool(&local_30);
    if ((bVar2) && (bVar1)) {
      return false;
    }
  }
  if ((install_name.Value._7_1_ & 1) == 0) {
    install_name.Value._6_1_ = MacOSXRpathInstallNameDirDefault(this);
  }
LAB_0058ac2a:
  if (((install_name.Value._7_1_ & 1) == 0) && ((install_name.Value._6_1_ & 1) == 0)) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG",&local_c1);
    bVar1 = cmMakefile::IsSet(this_00,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
      std::operator<<((ostream *)&cm,"Attempting to use ");
      if ((install_name.Value._6_1_ & 1) == 0) {
        std::operator<<((ostream *)&cm,"@rpath");
      }
      else {
        std::operator<<((ostream *)&cm,"MACOSX_RPATH");
      }
      std::operator<<((ostream *)&cm," without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.");
      std::operator<<((ostream *)&cm,"  This could be because you are using a Mac OS X version");
      std::operator<<((ostream *)&cm," less than 10.5 or because CMake\'s platform configuration is"
                     );
      std::operator<<((ostream *)&cm," corrupt.");
      this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      local_248 = (undefined1  [8])this_01;
      std::__cxx11::ostringstream::str();
      GetBacktrace((cmGeneratorTarget *)local_278);
      cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_278 + 0x10),
                          (cmListFileBacktrace *)local_278);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_278);
      std::__cxx11::string::~string((string *)(local_278 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::DetermineHasMacOSXRpathInstallNameDir(
  const std::string& config) const
{
  bool install_name_is_rpath = false;
  bool macosx_rpath = false;

  if (!this->IsImported()) {
    if (this->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return false;
    }
    cmValue install_name = this->GetProperty("INSTALL_NAME_DIR");
    bool use_install_name = this->MacOSXUseInstallNameDir();
    if (install_name && use_install_name && *install_name == "@rpath") {
      install_name_is_rpath = true;
    } else if (install_name && use_install_name) {
      return false;
    }
    if (!install_name_is_rpath) {
      macosx_rpath = this->MacOSXRpathInstallNameDirDefault();
    }
  } else {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (!info->NoSOName && !info->SOName.empty()) {
        if (cmHasLiteralPrefix(info->SOName, "@rpath/")) {
          install_name_is_rpath = true;
        }
      } else {
        std::string install_name;
        cmSystemTools::GuessLibraryInstallName(info->Location, install_name);
        if (install_name.find("@rpath") != std::string::npos) {
          install_name_is_rpath = true;
        }
      }
    }
  }

  if (!install_name_is_rpath && !macosx_rpath) {
    return false;
  }

  if (!this->Makefile->IsSet("CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG")) {
    std::ostringstream w;
    w << "Attempting to use ";
    if (macosx_rpath) {
      w << "MACOSX_RPATH";
    } else {
      w << "@rpath";
    }
    w << " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.";
    w << "  This could be because you are using a Mac OS X version";
    w << " less than 10.5 or because CMake's platform configuration is";
    w << " corrupt.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return true;
}